

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ElabSystemTaskSyntax *pEVar1;
  Token TVar2;
  BumpAllocator *unaff_retaddr;
  BumpAllocator *in_stack_00000058;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000060;
  BumpAllocator *in_stack_000000f8;
  Token *in_stack_00000100;
  BumpAllocator *in_stack_ffffffffffffffa8;
  ArgumentListSyntax *in_stack_ffffffffffffffb0;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000060,in_stack_00000058);
  TVar2 = parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  if ((((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)((long)__fn + 0x38))->
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)._M_ptr !=
      (pointer)0x0) {
    deepClone<slang::syntax::ArgumentListSyntax>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  pEVar1 = BumpAllocator::
           emplace<slang::syntax::ElabSystemTaskSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::ArgumentListSyntax*,slang::parsing::Token>
                     (unaff_retaddr,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__fn,
                      (Token *)__child_stack,(ArgumentListSyntax **)TVar2.info,TVar2._0_8_);
  return (int)pEVar1;
}

Assistant:

static SyntaxNode* clone(const ElabSystemTaskSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ElabSystemTaskSyntax>(
        *deepClone(node.attributes, alloc),
        node.name.deepClone(alloc),
        node.arguments ? deepClone(*node.arguments, alloc) : nullptr,
        node.semi.deepClone(alloc)
    );
}